

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

bool __thiscall cmDebugger_impl::ClearBreakpoint(cmDebugger_impl *this,breakpoint_id id)

{
  __normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
  __first;
  __normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
  __last;
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  __normal_iterator<cmBreakpoint_*,_std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>_>
  __first_00;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointMutex);
  if (iVar3 == 0) {
    __first._M_current =
         (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl
         .super__Vector_impl_data._M_start;
    __last._M_current =
         (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl
         .super__Vector_impl_data._M_finish;
    __first_00 = std::
                 __remove_if<__gnu_cxx::__normal_iterator<cmBreakpoint*,std::vector<cmBreakpoint,std::allocator<cmBreakpoint>>>,__gnu_cxx::__ops::_Iter_pred<cmDebugger_impl::ClearBreakpoint(unsigned_long)::_lambda(cmBreakpoint_const&)_1_>>
                           (__first,__last,
                            (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jdavidberger[P]CMake_Source_cmDebugger_cxx:347:22)>
                             )id);
    std::vector<cmBreakpoint,_std::allocator<cmBreakpoint>_>::_M_erase
              (&this->breakpoints,(iterator)__first_00._M_current,
               (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    pcVar1 = (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pcVar2 = (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
    return (long)__last._M_current - (long)__first._M_current != (long)pcVar1 - (long)pcVar2;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool ClearBreakpoint(breakpoint_id id) override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    auto predicate = [id](const cmBreakpoint& breakpoint) {
      return breakpoint.Id == id;
    };
    auto originalSize = breakpoints.size();
    breakpoints.erase(
      std::remove_if(breakpoints.begin(), breakpoints.end(), predicate),
      breakpoints.end());
    return originalSize != breakpoints.size();
  }